

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.h
# Opt level: O0

shared_ptr<polyscope::render::TextureBuffer>
polyscope::render::
generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,3ul>,(polyscope::DeviceBufferType)1>
          (Engine *engine)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  string *unaff_retaddr;
  nullptr_t in_stack_ffffffffffffff98;
  element_type *this;
  allocator local_31;
  string local_30 [48];
  
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"bad call",&local_31);
  exception(unaff_retaddr);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)this,in_stack_ffffffffffffff98);
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(Engine* engine) {
  exception("bad call"); // default implementation, should be specialized to use
  return nullptr;
}